

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O1

void __thiscall BaseHarnessHandlers::printFile(BaseHarnessHandlers *this,XMLURL *url)

{
  short *psVar1;
  short *psVar2;
  XMLCh *pXVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  XMLByte buffer [256];
  StrX local_138 [33];
  
  if (*(long *)(url + 0x48) == 0) {
    xercesc_4_0::XMLURL::buildFullText();
  }
  pXVar3 = *(XMLCh **)(url + 0x48);
  if (pXVar3 != L"file://dummy/") {
    if (pXVar3 != (XMLCh *)0x0) {
      lVar8 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + lVar8);
        if (*psVar1 == 0) {
          if (*(short *)((long)L"file://dummy/" + lVar8) == 0) {
            return;
          }
          break;
        }
        psVar2 = (short *)((long)L"file://dummy/" + lVar8);
        lVar8 = lVar8 + 2;
      } while (*psVar1 == *psVar2);
    }
    plVar5 = (long *)xercesc_4_0::XMLURL::makeNewStream();
    if (plVar5 == (long *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File ",5);
      if (*(long *)(url + 0x48) == 0) {
        xercesc_4_0::XMLURL::buildFullText();
      }
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (*(wchar16 **)(url + 0x48),
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_138[0].fLocalForm = pcVar6;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1140e8);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is missing",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      StrX::~StrX(local_138);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Content of file ",0x10);
      if (*(long *)(url + 0x48) == 0) {
        xercesc_4_0::XMLURL::buildFullText();
      }
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (*(wchar16 **)(url + 0x48),
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_138[0].fLocalForm = pcVar6;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1140e8);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      StrX::~StrX(local_138);
      lVar8 = (**(code **)(*plVar5 + 0x18))(plVar5,local_138,0xff);
      while (lVar8 != 0) {
        *(undefined1 *)((long)&local_138[0].fLocalForm + lVar8) = 0;
        uVar9 = 0;
        do {
          iVar4 = xercesc_4_0::XMLString::indexOf
                            ((char *)local_138,'\r',uVar9,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          if (iVar4 == -1) {
            bVar10 = false;
          }
          else {
            uVar9 = (ulong)iVar4;
            pcVar6 = (char *)((long)&local_138[0].fLocalForm + uVar9 + 1);
            lVar8 = xercesc_4_0::XMLString::stringLen(pcVar6);
            memmove((void *)((long)&local_138[0].fLocalForm + uVar9),pcVar6,lVar8 + 1);
            bVar10 = *(char *)((long)&local_138[0].fLocalForm + uVar9) != '\0';
          }
        } while (bVar10);
        sVar7 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_138,sVar7);
        lVar8 = (**(code **)(*plVar5 + 0x18))(plVar5,local_138,0xff);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  return;
}

Assistant:

void BaseHarnessHandlers::printFile(XMLURL& url)
{
    if(XMLString::equals(url.getURLText(), dummy))
        return;
    BinInputStream* stream=url.makeNewStream();
    if(stream==NULL)
    {
        std::cout << "File " << StrX(url.getURLText()) << " is missing" << std::endl;
        return;
    }
    std::cout << "Content of file " << StrX(url.getURLText()) << std::endl;
    XMLByte buffer[256];
    XMLSize_t nRead;
    while((nRead=stream->readBytes(buffer, 255)) >0)
    {
        buffer[nRead]=0;
        // sending data containing \n\r to cout generates \n\n\r, so strip any \r
        XMLSize_t idx=0;
        while(true)
        {
            int cr=XMLString::indexOf((const char*)buffer, '\r', idx);
            if(cr==-1)
                break;
            memmove(&buffer[cr], &buffer[cr+1], XMLString::stringLen((const char*)&buffer[cr+1])+1);
            idx=cr;
            if(buffer[idx]==0)
                break;
        }
        std::cout << (const char*)buffer;
    }
    std::cout << std::endl;
    delete stream;
}